

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapOneofField
          (Reflection *this,Message *message1,Message *message2,OneofDescriptor *oneof_descriptor)

{
  float key;
  int iVar1;
  LogMessage *pLVar2;
  FieldDescriptor *field;
  double *pdVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  uint32 *puVar6;
  long *plVar7;
  float *pfVar8;
  bool *pbVar9;
  FieldDescriptor *field_00;
  int *value;
  Message *sub_message;
  ulong uVar10;
  string local_128;
  string local_108;
  long local_e8;
  int64 temp_int64;
  uint64 temp_uint64;
  double temp_double;
  string temp_string;
  undefined1 local_a8 [60];
  uint32 local_6c;
  uint local_68;
  int32 temp_int32;
  uint32 temp_uint32;
  float temp_float;
  int temp_int;
  Message *local_50;
  LogMessage *local_48;
  bool local_39;
  LogMessage *pLStack_38;
  bool temp_bool;
  
  iVar1 = *(int *)(oneof_descriptor + 0x18);
  pLStack_38 = (LogMessage *)message1;
  if ((iVar1 == 1) && (*(char *)(**(long **)(oneof_descriptor + 0x20) + 0x41) == '\x01')) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
               ,0x1df);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_a8,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&temp_double,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    iVar1 = *(int *)(oneof_descriptor + 0x18);
  }
  if ((iVar1 == 1) && (*(char *)(**(long **)(oneof_descriptor + 0x20) + 0x41) == '\x01')) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
               ,0x761);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_a8,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&temp_double,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    iVar1 = *(int *)(oneof_descriptor + 0x18);
  }
  uVar10 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                      *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4) *
                         -0x55555554 + (this->schema_).oneof_case_offset_);
  key = *(float *)((long)&pLStack_38->level_ + uVar10);
  if ((iVar1 == 1) && (*(char *)(**(long **)(oneof_descriptor + 0x20) + 0x41) == '\x01')) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
               ,0x761);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_a8,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&temp_double,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    uVar10 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                        *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4)
                           * -0x55555554 + (this->schema_).oneof_case_offset_);
  }
  iVar1 = *(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar10);
  temp_double = (double)&temp_string._M_string_length;
  temp_string._M_dataplus._M_p = (pointer)0x0;
  temp_string._M_string_length._0_1_ = 0;
  temp_float = key;
  local_50 = message2;
  if (key == 0.0) {
    local_48 = (LogMessage *)0x0;
    field = (FieldDescriptor *)0x0;
  }
  else {
    field = Descriptor::FindFieldByNumber(this->descriptor_,(int)key);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
      _temp_int = (code *)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
                 (FieldDescriptor **)&temp_int);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
      puVar6 = (uint32 *)GetRaw<int>(this,(Message *)pLStack_38,field);
      local_6c = *puVar6;
      break;
    case 2:
      plVar7 = GetRaw<long>(this,(Message *)pLStack_38,field);
      local_e8 = *plVar7;
      break;
    case 3:
      puVar4 = GetRaw<unsigned_int>(this,(Message *)pLStack_38,field);
      local_68 = *puVar4;
      break;
    case 4:
      puVar5 = GetRaw<unsigned_long>(this,(Message *)pLStack_38,field);
      temp_int64 = *puVar5;
      break;
    case 5:
      pdVar3 = GetRaw<double>(this,(Message *)pLStack_38,field);
      temp_uint64 = (uint64)*pdVar3;
      break;
    case 6:
      pfVar8 = GetRaw<float>(this,(Message *)pLStack_38,field);
      temp_int32 = (int32)*pfVar8;
      break;
    case 7:
      pbVar9 = GetRaw<bool>(this,(Message *)pLStack_38,field);
      local_39 = *pbVar9;
      break;
    case 8:
      puVar6 = (uint32 *)GetRaw<int>(this,(Message *)pLStack_38,field);
      temp_uint32 = *puVar6;
      break;
    case 9:
      GetString_abi_cxx11_((string *)local_a8,this,(Message *)pLStack_38,field);
      std::__cxx11::string::operator=((string *)&temp_double,(string *)local_a8);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_);
      }
      break;
    case 10:
      local_48 = (LogMessage *)
                 ReleaseMessage(this,(Message *)pLStack_38,field,(MessageFactory *)0x0);
      goto LAB_002ba2a5;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x20b);
      pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_a8,"Unimplemented type: ");
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        _temp_int = FieldDescriptor::TypeOnceInit;
        temp_string.field_2._8_8_ = field;
        local_48 = pLVar2;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&temp_int,
                   (FieldDescriptor **)((long)&temp_string.field_2 + 8));
        pLVar2 = local_48;
      }
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field + 0x38) * 4));
      internal::LogFinisher::operator=((LogFinisher *)&temp_int,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    }
    local_48 = (LogMessage *)0x0;
  }
LAB_002ba2a5:
  if (iVar1 == 0) {
    ClearOneof(this,(Message *)pLStack_38,oneof_descriptor);
  }
  else {
    field_00 = Descriptor::FindFieldByNumber(this->descriptor_,iVar1);
    if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
      local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
      _temp_int = (code *)field_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
                 (FieldDescriptor **)&temp_int);
    }
    switch(*(undefined4 *)
            (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_00 + 0x38) * 4)) {
    case 1:
    case 8:
      value = GetRaw<int>(this,local_50,field_00);
      SetField<int>(this,(Message *)pLStack_38,field_00,value);
      break;
    case 2:
      plVar7 = GetRaw<long>(this,local_50,field_00);
      SetField<long>(this,(Message *)pLStack_38,field_00,plVar7);
      break;
    case 3:
      puVar4 = GetRaw<unsigned_int>(this,local_50,field_00);
      SetField<unsigned_int>(this,(Message *)pLStack_38,field_00,puVar4);
      break;
    case 4:
      puVar5 = GetRaw<unsigned_long>(this,local_50,field_00);
      SetField<unsigned_long>(this,(Message *)pLStack_38,field_00,puVar5);
      break;
    case 5:
      pdVar3 = GetRaw<double>(this,local_50,field_00);
      SetField<double>(this,(Message *)pLStack_38,field_00,pdVar3);
      break;
    case 6:
      pfVar8 = GetRaw<float>(this,local_50,field_00);
      SetField<float>(this,(Message *)pLStack_38,field_00,pfVar8);
      break;
    case 7:
      pbVar9 = GetRaw<bool>(this,local_50,field_00);
      SetField<bool>(this,(Message *)pLStack_38,field_00,pbVar9);
      break;
    case 9:
      GetString_abi_cxx11_(&local_128,this,local_50,field_00);
      SetString(this,(Message *)pLStack_38,field_00,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      break;
    case 10:
      sub_message = ReleaseMessage(this,local_50,field_00,(MessageFactory *)0x0);
      SetAllocatedMessage(this,(Message *)pLStack_38,sub_message,field_00);
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x22a);
      pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_a8,"Unimplemented type: ");
      if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
        _temp_int = FieldDescriptor::TypeOnceInit;
        temp_string.field_2._8_8_ = field_00;
        pLStack_38 = pLVar2;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&temp_int,
                   (FieldDescriptor **)((long)&temp_string.field_2 + 8));
        pLVar2 = pLStack_38;
      }
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field_00 + 0x38) * 4));
      internal::LogFinisher::operator=((LogFinisher *)&temp_int,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    }
  }
  if (temp_float == 0.0) {
    ClearOneof(this,local_50,oneof_descriptor);
    goto LAB_002ba713;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
    _temp_int = (code *)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
               (FieldDescriptor **)&temp_int);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    puVar6 = &local_6c;
    goto LAB_002ba5f0;
  case 2:
    SetField<long>(this,local_50,field,&local_e8);
    break;
  case 3:
    SetField<unsigned_int>(this,local_50,field,&local_68);
    break;
  case 4:
    SetField<unsigned_long>(this,local_50,field,(unsigned_long *)&temp_int64);
    break;
  case 5:
    SetField<double>(this,local_50,field,(double *)&temp_uint64);
    break;
  case 6:
    SetField<float>(this,local_50,field,(float *)&temp_int32);
    break;
  case 7:
    SetField<bool>(this,local_50,field,&local_39);
    break;
  case 8:
    puVar6 = &temp_uint32;
LAB_002ba5f0:
    SetField<int>(this,local_50,field,(int *)puVar6);
    break;
  case 9:
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,temp_double,temp_string._M_dataplus._M_p + (long)temp_double);
    SetString(this,local_50,field,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    break;
  case 10:
    SetAllocatedMessage(this,local_50,(Message *)local_48,field);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_reflection.cc"
               ,0x24a);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_a8,"Unimplemented type: ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      _temp_int = FieldDescriptor::TypeOnceInit;
      temp_string.field_2._8_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&temp_int,
                 (FieldDescriptor **)((long)&temp_string.field_2 + 8));
    }
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                       (ulong)*(uint *)(field + 0x38) * 4));
    internal::LogFinisher::operator=((LogFinisher *)&temp_int,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_a8);
  }
LAB_002ba713:
  if ((size_type *)temp_double != &temp_string._M_string_length) {
    operator_delete((void *)temp_double);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* message1, Message* message2,
                                const OneofDescriptor* oneof_descriptor) const {
  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = nullptr;
  std::string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = nullptr;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    // oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:           \
    temp_##TYPE = GetField<TYPE>(*message1, field1); \
    break;

      GET_TEMP_VALUE(INT32, int32);
      GET_TEMP_VALUE(INT64, int64);
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT, float);
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL, bool);
      GET_TEMP_VALUE(ENUM, int);
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 = descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                               \
    SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
    break;

      SET_ONEOF_VALUE1(INT32, int32);
      SET_ONEOF_VALUE1(INT64, int64);
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT, float);
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL, bool);
      SET_ONEOF_VALUE1(ENUM, int);
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1, ReleaseMessage(message2, field2), field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)            \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    SetField<TYPE>(message2, field1, temp_##TYPE); \
    break;

      SET_ONEOF_VALUE2(INT32, int32);
      SET_ONEOF_VALUE2(INT64, int64);
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT, float);
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL, bool);
      SET_ONEOF_VALUE2(ENUM, int);
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}